

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall wasm::FunctionValidator::visitArrayInit(FunctionValidator *this,ArrayInit *curr)

{
  Type TVar1;
  bool bVar2;
  Module *pMVar3;
  DataSegment *pDVar4;
  ElementSegment *pEVar5;
  byte local_d9;
  ElementSegment *seg;
  HeapType local_98;
  uintptr_t local_90;
  Type local_88;
  Field element;
  HeapType local_70;
  HeapType heapType;
  Type local_60;
  Type local_58;
  BasicType local_4c;
  Type local_48;
  Type local_40;
  Type local_38;
  Type local_30;
  Type local_28;
  Type local_20;
  ArrayInit *local_18;
  ArrayInit *curr_local;
  FunctionValidator *this_local;
  
  local_18 = curr;
  curr_local = (ArrayInit *)this;
  pMVar3 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     );
  bVar2 = FeatureSet::hasGC(&pMVar3->features);
  shouldBeTrue<wasm::ArrayInit*>(this,bVar2,local_18,"array.init_* requires gc [--enable-gc]");
  local_20.id = (local_18->index->type).id;
  wasm::Type::Type(&local_28,i32);
  shouldBeEqualOrFirstIsUnreachable<wasm::ArrayInit*,wasm::Type>
            (this,local_20,local_28,local_18,"array.init_* index must be an i32");
  local_30.id = (local_18->offset->type).id;
  wasm::Type::Type(&local_38,i32);
  shouldBeEqualOrFirstIsUnreachable<wasm::ArrayInit*,wasm::Type>
            (this,local_30,local_38,local_18,"array.init_* offset must be an i32");
  local_40.id = (local_18->size->type).id;
  wasm::Type::Type(&local_48,i32);
  shouldBeEqualOrFirstIsUnreachable<wasm::ArrayInit*,wasm::Type>
            (this,local_40,local_48,local_18,"array.init_* size must be an i32");
  local_4c = unreachable;
  bVar2 = wasm::Type::operator==
                    (&(local_18->super_SpecificExpression<(wasm::Expression::Id)71>).
                      super_Expression.type,&local_4c);
  if (!bVar2) {
    local_58.id = (local_18->ref->type).id;
    HeapType::HeapType(&heapType,array);
    wasm::Type::Type(&local_60,heapType,Nullable);
    bVar2 = shouldBeSubType(this,local_58,local_60,(Expression *)local_18,
                            "array.init_* destination must be an array reference");
    if (bVar2) {
      local_70 = wasm::Type::getHeapType(&local_18->ref->type);
      element.mutable_ = 0xb;
      bVar2 = HeapType::operator==(&local_70,&element.mutable_);
      local_d9 = 1;
      if (!bVar2) {
        bVar2 = HeapType::isArray(&local_70);
        bVar2 = shouldBeTrue<wasm::ArrayInit*>
                          (this,bVar2,local_18,"array.init_* destination must be an array reference"
                          );
        local_d9 = bVar2 ^ 0xff;
      }
      if ((local_d9 & 1) == 0) {
        HeapType::getArray(&local_98);
        local_88.id = local_98.id;
        element.type.id = local_90;
        TVar1.id = element.type.id;
        element.type.id._4_4_ = (int)(local_90 >> 0x20);
        bVar2 = element.type.id._4_4_ != 0;
        element.type.id = TVar1.id;
        shouldBeTrue<wasm::ArrayInit*>
                  (this,bVar2,local_18,"array.init_* destination must be mutable");
        if (local_18->op == InitData) {
          pMVar3 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::
                   getModule(&(this->
                              super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                              ).
                              super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                              .
                              super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                            );
          pDVar4 = Module::getDataSegmentOrNull(pMVar3,(Name)(local_18->segment).super_IString.str);
          shouldBeTrue<wasm::ArrayInit*>
                    (this,pDVar4 != (DataSegment *)0x0,local_18,"array.init_data segment must exist"
                    );
          bVar2 = wasm::Type::isNumber(&local_88);
          shouldBeTrue<wasm::ArrayInit*>
                    (this,bVar2,local_18,"array.init_data destination must be numeric");
        }
        else {
          if (local_18->op != InitElem) {
            __assert_fail("curr->op == InitElem",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-validator.cpp"
                          ,0xbba,"void wasm::FunctionValidator::visitArrayInit(ArrayInit *)");
          }
          pMVar3 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::
                   getModule(&(this->
                              super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                              ).
                              super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                              .
                              super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                            );
          pEVar5 = Module::getElementSegmentOrNull
                             (pMVar3,(Name)(local_18->segment).super_IString.str);
          bVar2 = shouldBeTrue<wasm::ArrayInit*>
                            (this,pEVar5 != (ElementSegment *)0x0,local_18,
                             "array.init_elem segment must exist");
          if (bVar2) {
            shouldBeSubType(this,(Type)(pEVar5->type).id,local_88,(Expression *)local_18,
                            "array.init_elem segment type must match destination type");
          }
        }
      }
    }
  }
  return;
}

Assistant:

void FunctionValidator::visitArrayInit(ArrayInit* curr) {
  shouldBeTrue(getModule()->features.hasGC(),
               curr,
               "array.init_* requires gc [--enable-gc]");
  shouldBeEqualOrFirstIsUnreachable(curr->index->type,
                                    Type(Type::i32),
                                    curr,
                                    "array.init_* index must be an i32");
  shouldBeEqualOrFirstIsUnreachable(curr->offset->type,
                                    Type(Type::i32),
                                    curr,
                                    "array.init_* offset must be an i32");
  shouldBeEqualOrFirstIsUnreachable(curr->size->type,
                                    Type(Type::i32),
                                    curr,
                                    "array.init_* size must be an i32");
  if (curr->type == Type::unreachable) {
    return;
  }
  if (!shouldBeSubType(curr->ref->type,
                       Type(HeapType::array, Nullable),
                       curr,
                       "array.init_* destination must be an array reference")) {
    return;
  }
  auto heapType = curr->ref->type.getHeapType();
  if (heapType == HeapType::none ||
      !shouldBeTrue(heapType.isArray(),
                    curr,
                    "array.init_* destination must be an array reference")) {
    return;
  }
  auto element = heapType.getArray().element;
  shouldBeTrue(
    element.mutable_, curr, "array.init_* destination must be mutable");
  if (curr->op == InitData) {
    shouldBeTrue(getModule()->getDataSegmentOrNull(curr->segment),
                 curr,
                 "array.init_data segment must exist");
    shouldBeTrue(element.type.isNumber(),
                 curr,
                 "array.init_data destination must be numeric");
  } else {
    assert(curr->op == InitElem);
    auto* seg = getModule()->getElementSegmentOrNull(curr->segment);
    if (!shouldBeTrue(seg, curr, "array.init_elem segment must exist")) {
      return;
    }
    shouldBeSubType(seg->type,
                    element.type,
                    curr,
                    "array.init_elem segment type must match destination type");
  }
}